

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_add_lm_file(ps_decoder_t *ps,char *name,char *path)

{
  ngram_model_t *lm_00;
  int result;
  ngram_model_t *lm;
  char *path_local;
  char *name_local;
  ps_decoder_t *ps_local;
  
  lm_00 = ngram_model_read(ps->config,path,NGRAM_AUTO,ps->lmath);
  if (lm_00 == (ngram_model_t *)0x0) {
    ps_local._4_4_ = -1;
  }
  else {
    ps_local._4_4_ = ps_add_lm(ps,name,lm_00);
    ngram_model_free(lm_00);
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_add_lm_file(ps_decoder_t *ps, const char *name, const char *path)
{
  ngram_model_t *lm;
  int result;

  lm = ngram_model_read(ps->config, path, NGRAM_AUTO, ps->lmath);
  if (!lm)
      return -1;

  result = ps_add_lm(ps, name, lm);
  ngram_model_free(lm);
  return result;
}